

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::XmlUnitTestResultPrinter::ListTestsMatchingFilter
          (XmlUnitTestResultPrinter *this,
          vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  FILE *__stream;
  stringstream stream;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  __stream = (FILE *)OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream(local_1a0);
  PrintXmlTestsList(local_190,test_suites);
  StringStreamToString(&local_1c0,(stringstream *)local_1a0);
  fputs(local_1c0._M_dataplus._M_p,__stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::ListTestsMatchingFilter(
    const std::vector<TestSuite*>& test_suites) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlTestsList(&stream, test_suites);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}